

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall TApp_BadSubcomSearch_Test::TestBody(TApp_BadSubcomSearch_Test *this)

{
  bool bVar1;
  App *pAVar2;
  AssertHelper local_f8;
  Message local_f0 [2];
  OptionNotFound *anon_var_0;
  char *pcStack_d8;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  string local_c8;
  allocator local_a1;
  string local_a0;
  App *local_80;
  App *two;
  string local_70;
  allocator local_39;
  string local_38;
  App *local_18;
  App *one;
  TApp_BadSubcomSearch_Test *this_local;
  
  one = (App *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"one",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"",(allocator *)((long)&two + 7));
  pAVar2 = CLI::App::add_subcommand(&(this->super_TApp).app,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&two + 7));
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pAVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"two",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"",(allocator *)((long)&gtest_msg.value + 7));
  pAVar2 = CLI::App::add_subcommand(pAVar2,&local_a0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_80 = pAVar2;
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff28,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff28);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      CLI::App::get_subcommand(&(this->super_TApp).app,local_80);
    }
    if ((anon_var_0._7_1_ & 1) != 0) {
      return;
    }
    pcStack_d8 = 
    "Expected: app.get_subcommand(two) throws an exception of type CLI::OptionNotFound.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_f0);
  testing::internal::AssertHelper::AssertHelper
            (&local_f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x18b,pcStack_d8);
  testing::internal::AssertHelper::operator=(&local_f8,local_f0);
  testing::internal::AssertHelper::~AssertHelper(&local_f8);
  testing::Message::~Message(local_f0);
  return;
}

Assistant:

TEST_F(TApp, BadSubcomSearch) {

    auto one = app.add_subcommand("one");
    auto two = one->add_subcommand("two");

    EXPECT_THROW(app.get_subcommand(two), CLI::OptionNotFound);
}